

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O0

void __thiscall Barrier::decreaseBarrier(Barrier *this)

{
  __int_type _Var1;
  runtime_error *this_00;
  condition_variable *in_RDI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffc0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_RDI);
  if (_Var1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Barrier aleady opened!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _Var1 = std::__atomic_base<int>::operator--((__atomic_base<int> *)in_RDI);
  if (_Var1 == 0) {
    std::condition_variable::notify_all();
  }
  else {
    std::condition_variable::wait<Barrier::decreaseBarrier()::__0>
              (in_RDI,in_stack_ffffffffffffffc0,(anon_class_8_1_8991fb9c)in_RDI);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void Barrier::decreaseBarrier () {
	std::unique_lock<std::mutex> lock (barrierMutex);

	if (activitiesNumber == 0)
		throw std::runtime_error ("Barrier aleady opened!");
	
	if (--activitiesNumber == 0)
		barrierCV.notify_all ();
	else
		barrierCV.wait (lock, [&] {return activitiesNumber == 0;});
}